

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::GetTypeUrl_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,string_view message_name,
          string_view type_url_prefix)

{
  string_view pc;
  string_view pc_00;
  string_view pc_01;
  string_view pc_02;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  AlphaNum *b;
  char *pcVar4;
  AlphaNum *c;
  AlphaNum local_150;
  AlphaNum local_120;
  AlphaNum *local_f0;
  size_t local_e8;
  AlphaNum local_e0;
  char *local_b0;
  char *local_a8;
  AlphaNum local_a0;
  AlphaNum *local_70;
  size_t local_68;
  AlphaNum local_60;
  undefined1 local_30 [8];
  string_view type_url_prefix_local;
  string_view message_name_local;
  
  c = (AlphaNum *)type_url_prefix._M_len;
  b = (AlphaNum *)message_name._M_str;
  pcVar4 = (char *)message_name._M_len;
  local_30 = (undefined1  [8])b;
  type_url_prefix_local._M_len = (size_t)c;
  type_url_prefix_local._M_str = (char *)this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  if (!bVar1) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_30,sVar2 - 1);
    if (*pvVar3 == '/') {
      local_70 = (AlphaNum *)local_30;
      local_68 = type_url_prefix_local._M_len;
      pc_02._M_str = (char *)type_url_prefix_local._M_len;
      pc_02._M_len = (size_t)local_30;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_60,pc_02);
      local_b0 = type_url_prefix_local._M_str;
      pc_01._M_str = pcVar4;
      pc_01._M_len = (size_t)type_url_prefix_local._M_str;
      local_a8 = pcVar4;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_a0,pc_01);
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&local_60,&local_a0,b);
      return __return_storage_ptr__;
    }
  }
  local_f0 = (AlphaNum *)local_30;
  local_e8 = type_url_prefix_local._M_len;
  pc_00._M_str = (char *)type_url_prefix_local._M_len;
  pc_00._M_len = (size_t)local_30;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_e0,pc_00);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_120,"/");
  pc._M_str = pcVar4;
  pc._M_len = (size_t)type_url_prefix_local._M_str;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_150,pc);
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_e0,&local_120,&local_150,c);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeUrl(absl::string_view message_name,
                       absl::string_view type_url_prefix) {
  if (!type_url_prefix.empty() &&
      type_url_prefix[type_url_prefix.size() - 1] == '/') {
    return absl::StrCat(type_url_prefix, message_name);
  } else {
    return absl::StrCat(type_url_prefix, "/", message_name);
  }
}